

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O3

bool __thiscall
Assimp::CalcTangentsProcess::ProcessMesh(CalcTangentsProcess *this,aiMesh *pMesh,uint meshIndex)

{
  aiFace *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  aiVector3D *paVar25;
  aiVector3D *paVar26;
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *list;
  _func_int **pp_Var27;
  _func_int *p_Var28;
  bool bVar29;
  aiVector3D *__s;
  aiVector3D *__s_00;
  Base **ppBVar30;
  Logger *pLVar31;
  pointer puVar32;
  long lVar33;
  pointer puVar34;
  uint uVar35;
  ulong uVar36;
  uint *puVar37;
  uint b;
  ulong uVar38;
  aiVector3D *paVar39;
  aiMesh *pMesh_00;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  _IEEESingle temp;
  float fVar51;
  float fVar52;
  float fVar53;
  _IEEESingle temp_1;
  float fVar54;
  uint idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> closeVertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  SpatialSort _vertexFinder;
  uint local_25c;
  aiMesh *local_258;
  ai_real local_250;
  uint local_24c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  SpatialSort *local_230;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  CalcTangentsProcess *local_208;
  aiVector3D *local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  float fStack_1e0;
  float fStack_1dc;
  SpatialSort local_1d0;
  undefined1 local_1a8 [376];
  
  if (pMesh->mTangents != (aiVector3D *)0x0) {
    return false;
  }
  if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
    pLVar31 = DefaultLogger::get();
    Logger::info(pLVar31,"Tangents are undefined for line and point meshes");
    return false;
  }
  if (pMesh->mNormals == (aiVector3D *)0x0) {
    pLVar31 = DefaultLogger::get();
    Logger::error(pLVar31,"Failed to compute tangents; need normals");
    return false;
  }
  if ((7 < (ulong)this->configSourceUV) ||
     (pMesh->mTextureCoords[this->configSourceUV] == (aiVector3D *)0x0)) {
    pLVar31 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[52]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [52])"Failed to compute tangents; need UV data in channel");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar31,(char *)CONCAT71(local_1d0.mPlaneNormal._1_7_,
                                           local_1d0.mPlaneNormal.x._0_1_));
    if ((vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_> *)
        CONCAT71(local_1d0.mPlaneNormal._1_7_,local_1d0.mPlaneNormal.x._0_1_) !=
        &local_1d0.mPositions) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1d0.mPlaneNormal._1_7_,local_1d0.mPlaneNormal.x._0_1_));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return false;
  }
  local_230 = (SpatialSort *)CONCAT44(local_230._4_4_,meshIndex);
  local_1d0.mPlaneNormal.x._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_1a8,(ulong)pMesh->mNumVertices,
             (bool *)&local_1d0,(allocator_type *)&local_228);
  uVar35 = pMesh->mNumVertices;
  uVar36 = (ulong)uVar35 * 0xc;
  local_258 = pMesh;
  __s = (aiVector3D *)operator_new__(uVar36);
  if (uVar35 != 0) {
    memset(__s,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
  }
  local_258->mTangents = __s;
  __s_00 = (aiVector3D *)operator_new__(uVar36);
  local_208 = this;
  if (uVar35 != 0) {
    memset(__s_00,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
  }
  pMesh_00 = local_258;
  local_258->mBitangents = __s_00;
  paVar25 = local_258->mNormals;
  uVar35 = local_258->mNumFaces;
  if (uVar35 != 0) {
    paVar26 = local_258->mVertices;
    paVar39 = local_258->mTextureCoords[local_208->configSourceUV];
    uVar36 = 0;
    do {
      paVar1 = local_258->mFaces + uVar36;
      uVar22 = local_258->mFaces[uVar36].mNumIndices;
      if (uVar22 < 3) {
        if (uVar22 != 0) {
          uVar38 = 0;
          do {
            uVar35 = paVar1->mIndices[uVar38];
            *(ulong *)(local_1a8._0_8_ + (ulong)(uVar35 >> 6) * 8) =
                 *(ulong *)(local_1a8._0_8_ + (ulong)(uVar35 >> 6) * 8) |
                 1L << ((byte)uVar35 & 0x3f);
            __s[uVar35].x = NAN;
            __s[uVar35].y = NAN;
            __s[uVar35].z = NAN;
            __s_00[uVar35].x = NAN;
            __s_00[uVar35].y = NAN;
            __s_00[uVar35].z = NAN;
            uVar38 = uVar38 + 1;
          } while (uVar38 < paVar1->mNumIndices);
          uVar35 = local_258->mNumFaces;
        }
      }
      else {
        local_200 = (aiVector3D *)CONCAT44(local_200._4_4_,uVar35);
        puVar37 = paVar1->mIndices;
        uVar22 = *puVar37;
        uVar23 = puVar37[1];
        uVar24 = puVar37[2];
        uVar2 = paVar39[uVar22].x;
        uVar12 = paVar39[uVar22].y;
        uVar3 = paVar39[uVar24].x;
        uVar13 = paVar39[uVar24].y;
        uVar4 = paVar39[uVar23].x;
        uVar14 = paVar39[uVar23].y;
        fVar44 = (float)uVar3 - (float)uVar2;
        fVar46 = (float)uVar13 - (float)uVar12;
        fVar40 = (float)uVar4 - (float)uVar2;
        fVar41 = (float)uVar14 - (float)uVar12;
        fVar43 = fVar46 * fVar40;
        fVar42 = fVar41 * fVar44;
        if ((fVar43 == fVar44 * fVar41) && (!NAN(fVar43) && !NAN(fVar44 * fVar41))) {
          fVar44 = 1.0;
          fVar46 = 0.0;
          fVar40 = 0.0;
          fVar41 = 1.0;
        }
        fVar45 = paVar26[uVar23].z - paVar26[uVar22].z;
        uVar5 = paVar26[uVar23].x;
        uVar15 = paVar26[uVar23].y;
        uVar6 = paVar26[uVar22].x;
        uVar16 = paVar26[uVar22].y;
        uVar7 = paVar26[uVar24].x;
        uVar17 = paVar26[uVar24].y;
        fVar47 = paVar26[uVar24].z - paVar26[uVar22].z;
        local_1f8 = *(float *)(&DAT_007a47d8 + (ulong)(fVar42 - fVar43 < 0.0) * 4);
        fVar42 = (fVar41 * fVar47 - fVar46 * fVar45) * local_1f8;
        fVar43 = (fVar40 * fVar47 - fVar45 * fVar44) * local_1f8;
        fVar45 = (((float)uVar7 - (float)uVar6) * fVar41 - fVar46 * ((float)uVar5 - (float)uVar6)) *
                 local_1f8;
        fStack_1e0 = (((float)uVar17 - (float)uVar16) * fVar41 -
                     fVar46 * ((float)uVar15 - (float)uVar16)) * local_1f8;
        fVar46 = (fVar40 * ((float)uVar7 - (float)uVar6) - fVar44 * ((float)uVar5 - (float)uVar6)) *
                 local_1f8;
        local_1f8 = (fVar40 * ((float)uVar17 - (float)uVar16) -
                    fVar44 * ((float)uVar15 - (float)uVar16)) * local_1f8;
        local_1e8 = (aiVector3D *)CONCAT44(fStack_1e0,fStack_1e0);
        uVar38 = 0;
        do {
          uVar22 = paVar1->mIndices[uVar38];
          fVar44 = paVar25[uVar22].x;
          uVar8 = paVar25[uVar22].x;
          uVar18 = paVar25[uVar22].y;
          uVar9 = paVar25[uVar22].y;
          uVar19 = paVar25[uVar22].z;
          fVar40 = fVar42 * (float)uVar19 + fVar45 * fVar44 + fStack_1e0 * (float)uVar9;
          fVar47 = fVar45 - fVar40 * (float)uVar8;
          fVar51 = fStack_1e0 - fVar40 * (float)uVar18;
          fVar54 = fVar42 - (float)uVar19 * fVar40;
          fVar40 = SQRT(fVar54 * fVar54 + fVar47 * fVar47 + fVar51 * fVar51);
          fVar41 = 1.0 / fVar40;
          if (0.0 < fVar40) {
            fVar47 = fVar47 * fVar41;
            fVar51 = fVar51 * fVar41;
          }
          fVar48 = fVar43 * (float)uVar19 + fVar46 * fVar44 + local_1f8 * (float)uVar9;
          fVar52 = fVar46 - (float)uVar8 * fVar48;
          fVar53 = local_1f8 - (float)uVar18 * fVar48;
          fVar48 = fVar43 - (float)uVar19 * fVar48;
          fVar50 = SQRT(fVar48 * fVar48 + fVar52 * fVar52 + fVar53 * fVar53);
          fVar49 = 1.0 / fVar50;
          if (0.0 < fVar50) {
            fVar52 = fVar52 * fVar49;
            fVar53 = fVar53 * fVar49;
          }
          fVar40 = (float)(~-(uint)(0.0 < fVar40) & (uint)fVar54 |
                          (uint)(fVar41 * fVar54) & -(uint)(0.0 < fVar40));
          fVar41 = (float)(~-(uint)(0.0 < fVar50) & (uint)fVar48 |
                          (uint)(fVar49 * fVar48) & -(uint)(0.0 < fVar50));
          if (((uint)ABS(fVar41) < 0x7f800000 &&
              ((uint)ABS(fVar53) < 0x7f800000 && (uint)ABS(fVar52) < 0x7f800000)) ==
              ((0x7f7fffff < (uint)ABS(fVar51) || 0x7f7fffff < (uint)ABS(fVar47)) ||
              0x7f7fffff < (uint)ABS(fVar40))) {
            if ((0x7f7fffff < (uint)ABS(fVar51) || 0x7f7fffff < (uint)ABS(fVar47)) ||
                0x7f7fffff < (uint)ABS(fVar40)) {
              fVar47 = fVar41 * (float)uVar9 - fVar53 * (float)uVar19;
              fVar51 = fVar52 * (float)uVar19 - fVar41 * fVar44;
              fVar40 = fVar53 * fVar44 - fVar52 * (float)uVar9;
              fVar44 = SQRT(fVar40 * fVar40 + fVar47 * fVar47 + fVar51 * fVar51);
              if (0.0 < fVar44) {
                fVar44 = 1.0 / fVar44;
                fVar40 = fVar40 * fVar44;
                fVar47 = fVar47 * fVar44;
                fVar51 = fVar51 * fVar44;
              }
            }
            else {
              fVar52 = (float)uVar19 * fVar51 - fVar40 * (float)uVar9;
              fVar53 = fVar44 * fVar40 - fVar47 * (float)uVar19;
              fVar41 = fVar47 * (float)uVar9 - fVar51 * fVar44;
              fVar44 = SQRT(fVar41 * fVar41 + fVar52 * fVar52 + fVar53 * fVar53);
              if (0.0 < fVar44) {
                fVar44 = 1.0 / fVar44;
                fVar41 = fVar41 * fVar44;
                fVar52 = fVar52 * fVar44;
                fVar53 = fVar53 * fVar44;
              }
            }
          }
          __s[uVar22].x = fVar47;
          __s[uVar22].y = fVar51;
          __s[uVar22].z = fVar40;
          __s_00[uVar22].x = fVar52;
          __s_00[uVar22].y = fVar53;
          __s_00[uVar22].z = fVar41;
          uVar38 = uVar38 + 1;
          fStack_1f4 = local_1f8;
          fStack_1f0 = local_1f8;
          fStack_1ec = local_1f8;
          fStack_1dc = fStack_1e0;
        } while (uVar38 < paVar1->mNumIndices);
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 < uVar35);
  }
  SpatialSort::SpatialSort(&local_1d0);
  list = &((local_208->super_BaseProcess).shared)->pmap;
  if (list != (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
               *)0x0) {
    local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ppBVar30 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                         (list,"$Spat",(Base **)&local_228);
    if ((*ppBVar30 != (Base *)0x0) &&
       (pp_Var27 = (*ppBVar30)[1]._vptr_Base, pp_Var27 != (_func_int **)0x0)) {
      p_Var28 = *pp_Var27;
      lVar33 = ((ulong)local_230 & 0xffffffff) * 0x30;
      local_230 = (SpatialSort *)(p_Var28 + lVar33);
      local_250 = *(ai_real *)(p_Var28 + lVar33 + 0x28);
      goto LAB_0070780b;
    }
  }
  local_230 = &local_1d0;
  SpatialSort::Fill(local_230,pMesh_00->mVertices,pMesh_00->mNumVertices,0xc,true);
  local_250 = ComputePositionEpsilon(pMesh_00);
LAB_0070780b:
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar36 = 0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = cosf(local_208->configMaxAngle);
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_25c = 0;
  if (pMesh_00->mNumVertices != 0) {
    puVar37 = (uint *)0x0;
    do {
      if ((*(ulong *)(local_1a8._0_8_ + (uVar36 >> 6) * 8) >> (uVar36 & 0x3f) & 1) == 0) {
        paVar26 = pMesh_00->mVertices;
        paVar39 = pMesh_00->mNormals + uVar36;
        local_1e8 = pMesh_00->mTangents + uVar36;
        local_200 = pMesh_00->mBitangents + uVar36;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_248,0);
        SpatialSort::FindPositions(local_230,paVar26 + uVar36,local_250,&local_228);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (&local_248,
                   ((long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) + 5);
        if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_248,
                     (iterator)
                     local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_25c);
        }
        else {
          *local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_25c;
          local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        paVar26 = local_200;
        if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          puVar32 = local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar34 = local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar36 = 0;
          uVar38 = 1;
          do {
            local_24c = puVar32[uVar36];
            uVar36 = (ulong)local_24c;
            if (((((*(ulong *)(local_1a8._0_8_ + (ulong)(local_24c >> 6) * 8) >> (uVar36 & 0x3f) & 1
                   ) == 0) &&
                 (0.9999 <= paVar25[uVar36].z * paVar39->z +
                            paVar25[uVar36].x * paVar39->x + paVar25[uVar36].y * paVar39->y)) &&
                (local_1f8 <=
                 __s[uVar36].z * local_1e8->z +
                 __s[uVar36].x * local_1e8->x + __s[uVar36].y * local_1e8->y)) &&
               (local_1f8 <=
                __s_00[uVar36].z * paVar26->z +
                __s_00[uVar36].x * paVar26->x + __s_00[uVar36].y * paVar26->y)) {
              if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_248,
                           (iterator)
                           local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_24c);
              }
              else {
                *local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_24c;
                local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              *(ulong *)(local_1a8._0_8_ + (ulong)(local_24c >> 6) * 8) =
                   *(ulong *)(local_1a8._0_8_ + (ulong)(local_24c >> 6) * 8) |
                   1L << ((byte)local_24c & 0x3f);
              puVar32 = local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              puVar34 = local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            bVar29 = uVar38 < (ulong)((long)puVar34 - (long)puVar32 >> 2);
            uVar36 = uVar38;
            uVar38 = (ulong)((int)uVar38 + 1);
          } while (bVar29);
        }
        uVar36 = (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        fVar44 = 0.0;
        fVar46 = 0.0;
        if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          fVar41 = 0.0;
          fVar40 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
        }
        else {
          fVar40 = 0.0;
          uVar38 = 0;
          fVar41 = 0.0;
          fVar42 = 0.0;
          fVar43 = 0.0;
          do {
            uVar35 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar38];
            uVar10 = __s[uVar35].x;
            uVar20 = __s[uVar35].y;
            fVar41 = fVar41 + __s[uVar35].z;
            fVar44 = fVar44 + (float)uVar10;
            fVar46 = fVar46 + (float)uVar20;
            uVar11 = __s_00[uVar35].x;
            uVar21 = __s_00[uVar35].y;
            fVar40 = fVar40 + __s_00[uVar35].z;
            fVar42 = fVar42 + (float)uVar11;
            fVar43 = fVar43 + (float)uVar21;
            uVar38 = uVar38 + 1;
          } while ((uVar38 & 0xffffffff) < uVar36);
        }
        puVar37 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMesh_00 = local_258;
        if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          fVar47 = 1.0 / SQRT(fVar41 * fVar41 + fVar44 * fVar44 + fVar46 * fVar46);
          fVar45 = 1.0 / SQRT(fVar40 * fVar40 + fVar42 * fVar42 + fVar43 * fVar43);
          uVar38 = 0;
          do {
            uVar35 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar38];
            __s[uVar35].x = fVar47 * fVar44;
            __s[uVar35].y = fVar47 * fVar46;
            __s[uVar35].z = fVar41 * fVar47;
            uVar35 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar38];
            __s_00[uVar35].x = fVar45 * fVar42;
            __s_00[uVar35].y = fVar45 * fVar43;
            __s_00[uVar35].z = fVar40 * fVar45;
            uVar38 = uVar38 + 1;
          } while ((uVar38 & 0xffffffff) < uVar36);
        }
      }
      local_25c = local_25c + 1;
      uVar36 = (ulong)local_25c;
    } while (local_25c < pMesh_00->mNumVertices);
    if (puVar37 != (uint *)0x0) {
      operator_delete(puVar37);
    }
  }
  if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  SpatialSort::~SpatialSort(&local_1d0);
  if ((_Bit_type *)local_1a8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  return true;
}

Assistant:

bool CalcTangentsProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshIndex)
{
    // we assume that the mesh is still in the verbose vertex format where each face has its own set
    // of vertices and no vertices are shared between faces. Sadly I don't know any quick test to
    // assert() it here.
    // assert( must be verbose, dammit);

    if (pMesh->mTangents) // this implies that mBitangents is also there
        return false;

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))
    {
        ASSIMP_LOG_INFO("Tangents are undefined for line and point meshes");
        return false;
    }

    // what we can check, though, is if the mesh has normals and texture coordinates. That's a requirement
    if( pMesh->mNormals == NULL)
    {
        ASSIMP_LOG_ERROR("Failed to compute tangents; need normals");
        return false;
    }
    if( configSourceUV >= AI_MAX_NUMBER_OF_TEXTURECOORDS || !pMesh->mTextureCoords[configSourceUV] )
    {
        ASSIMP_LOG_ERROR((Formatter::format("Failed to compute tangents; need UV data in channel"),configSourceUV));
        return false;
    }

    const float angleEpsilon = 0.9999f;

    std::vector<bool> vertexDone( pMesh->mNumVertices, false);
    const float qnan = get_qnan();

    // create space for the tangents and bitangents
    pMesh->mTangents = new aiVector3D[pMesh->mNumVertices];
    pMesh->mBitangents = new aiVector3D[pMesh->mNumVertices];

    const aiVector3D* meshPos = pMesh->mVertices;
    const aiVector3D* meshNorm = pMesh->mNormals;
    const aiVector3D* meshTex = pMesh->mTextureCoords[configSourceUV];
    aiVector3D* meshTang = pMesh->mTangents;
    aiVector3D* meshBitang = pMesh->mBitangents;

    // calculate the tangent and bitangent for every face
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)
        {
            // There are less than three indices, thus the tangent vector
            // is not defined. We are finished with these vertices now,
            // their tangent vectors are set to qnan.
            for (unsigned int i = 0; i < face.mNumIndices;++i)
            {
                unsigned int idx = face.mIndices[i];
                vertexDone  [idx] = true;
                meshTang    [idx] = aiVector3D(qnan);
                meshBitang  [idx] = aiVector3D(qnan);
            }

            continue;
        }

        // triangle or polygon... we always use only the first three indices. A polygon
        // is supposed to be planar anyways....
        // FIXME: (thom) create correct calculation for multi-vertex polygons maybe?
        const unsigned int p0 = face.mIndices[0], p1 = face.mIndices[1], p2 = face.mIndices[2];

        // position differences p1->p2 and p1->p3
        aiVector3D v = meshPos[p1] - meshPos[p0], w = meshPos[p2] - meshPos[p0];

        // texture offset p1->p2 and p1->p3
        float sx = meshTex[p1].x - meshTex[p0].x, sy = meshTex[p1].y - meshTex[p0].y;
        float tx = meshTex[p2].x - meshTex[p0].x, ty = meshTex[p2].y - meshTex[p0].y;
        float dirCorrection = (tx * sy - ty * sx) < 0.0f ? -1.0f : 1.0f;
        // when t1, t2, t3 in same position in UV space, just use default UV direction.
        if (  sx * ty == sy * tx ) {
            sx = 0.0; sy = 1.0;
            tx = 1.0; ty = 0.0;
        }

        // tangent points in the direction where to positive X axis of the texture coord's would point in model space
        // bitangent's points along the positive Y axis of the texture coord's, respectively
        aiVector3D tangent, bitangent;
        tangent.x = (w.x * sy - v.x * ty) * dirCorrection;
        tangent.y = (w.y * sy - v.y * ty) * dirCorrection;
        tangent.z = (w.z * sy - v.z * ty) * dirCorrection;
        bitangent.x = (w.x * sx - v.x * tx) * dirCorrection;
        bitangent.y = (w.y * sx - v.y * tx) * dirCorrection;
        bitangent.z = (w.z * sx - v.z * tx) * dirCorrection;

        // store for every vertex of that face
        for( unsigned int b = 0; b < face.mNumIndices; ++b ) {
            unsigned int p = face.mIndices[b];

            // project tangent and bitangent into the plane formed by the vertex' normal
            aiVector3D localTangent = tangent - meshNorm[p] * (tangent * meshNorm[p]);
            aiVector3D localBitangent = bitangent - meshNorm[p] * (bitangent * meshNorm[p]);
            localTangent.NormalizeSafe(); localBitangent.NormalizeSafe();

            // reconstruct tangent/bitangent according to normal and bitangent/tangent when it's infinite or NaN.
            bool invalid_tangent = is_special_float(localTangent.x) || is_special_float(localTangent.y) || is_special_float(localTangent.z);
            bool invalid_bitangent = is_special_float(localBitangent.x) || is_special_float(localBitangent.y) || is_special_float(localBitangent.z);
            if (invalid_tangent != invalid_bitangent) {
                if (invalid_tangent) {
                    localTangent = meshNorm[p] ^ localBitangent;
                    localTangent.NormalizeSafe();
                } else {
                    localBitangent = localTangent ^ meshNorm[p];
                    localBitangent.NormalizeSafe();
                }
            }

            // and write it into the mesh.
            meshTang[ p ]   = localTangent;
            meshBitang[ p ] = localBitangent;
        }
    }


    // create a helper to quickly find locally close vertices among the vertex array
    // FIX: check whether we can reuse the SpatialSort of a previous step
    SpatialSort* vertexFinder = NULL;
    SpatialSort  _vertexFinder;
    float posEpsilon;
    if (shared)
    {
        std::vector<std::pair<SpatialSort,float> >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)
        {
            std::pair<SpatialSort,float>& blubb = avf->operator [] (meshIndex);
            vertexFinder = &blubb.first;
            posEpsilon = blubb.second;;
        }
    }
    if (!vertexFinder)
    {
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        posEpsilon = ComputePositionEpsilon(pMesh);
    }
    std::vector<unsigned int> verticesFound;

    const float fLimit = std::cos(configMaxAngle);
    std::vector<unsigned int> closeVertices;

    // in the second pass we now smooth out all tangents and bitangents at the same local position
    // if they are not too far off.
    for( unsigned int a = 0; a < pMesh->mNumVertices; a++)
    {
        if( vertexDone[a])
            continue;

        const aiVector3D& origPos = pMesh->mVertices[a];
        const aiVector3D& origNorm = pMesh->mNormals[a];
        const aiVector3D& origTang = pMesh->mTangents[a];
        const aiVector3D& origBitang = pMesh->mBitangents[a];
        closeVertices.resize( 0 );

        // find all vertices close to that position
        vertexFinder->FindPositions( origPos, posEpsilon, verticesFound);

        closeVertices.reserve (verticesFound.size()+5);
        closeVertices.push_back( a);

        // look among them for other vertices sharing the same normal and a close-enough tangent/bitangent
        for( unsigned int b = 0; b < verticesFound.size(); b++)
        {
            unsigned int idx = verticesFound[b];
            if( vertexDone[idx])
                continue;
            if( meshNorm[idx] * origNorm < angleEpsilon)
                continue;
            if(  meshTang[idx] * origTang < fLimit)
                continue;
            if( meshBitang[idx] * origBitang < fLimit)
                continue;

            // it's similar enough -> add it to the smoothing group
            closeVertices.push_back( idx);
            vertexDone[idx] = true;
        }

        // smooth the tangents and bitangents of all vertices that were found to be close enough
        aiVector3D smoothTangent( 0, 0, 0), smoothBitangent( 0, 0, 0);
        for( unsigned int b = 0; b < closeVertices.size(); ++b)
        {
            smoothTangent += meshTang[ closeVertices[b] ];
            smoothBitangent += meshBitang[ closeVertices[b] ];
        }
        smoothTangent.Normalize();
        smoothBitangent.Normalize();

        // and write it back into all affected tangents
        for( unsigned int b = 0; b < closeVertices.size(); ++b)
        {
            meshTang[ closeVertices[b] ] = smoothTangent;
            meshBitang[ closeVertices[b] ] = smoothBitangent;
        }
    }
    return true;
}